

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.h
# Opt level: O0

void yyml::Factory<yyml::nn::Variable<double>_>::RemoveInstance(Variable<double> *instance)

{
  set<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>,yyml::detail::PointerComp<yyml::nn::Variable<double>>,std::allocator<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>>>
  *psVar1;
  register_type *this;
  iterator __position;
  bool local_39;
  iterator iter;
  _Self local_18;
  Variable<double> *local_10;
  Variable<double> *instance_local;
  
  local_39 = false;
  local_10 = instance;
  if (instance != (Variable<double> *)0x0) {
    psVar1 = (set<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>,yyml::detail::PointerComp<yyml::nn::Variable<double>>,std::allocator<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>>>
              *)registry();
    local_18._M_node =
         (_Base_ptr)
         std::
         set<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>,yyml::detail::PointerComp<yyml::nn::Variable<double>>,std::allocator<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>>>
         ::find<yyml::nn::Variable<double>*>(psVar1,&local_10);
    this = registry();
    iter = std::
           set<std::unique_ptr<yyml::nn::Variable<double>,_std::default_delete<yyml::nn::Variable<double>_>_>,_yyml::detail::PointerComp<yyml::nn::Variable<double>_>,_std::allocator<std::unique_ptr<yyml::nn::Variable<double>,_std::default_delete<yyml::nn::Variable<double>_>_>_>_>
           ::end(this);
    local_39 = std::operator!=(&local_18,&iter);
  }
  if (local_39 != false) {
    psVar1 = (set<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>,yyml::detail::PointerComp<yyml::nn::Variable<double>>,std::allocator<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>>>
              *)registry();
    __position = std::
                 set<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>,yyml::detail::PointerComp<yyml::nn::Variable<double>>,std::allocator<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>>>
                 ::find<yyml::nn::Variable<double>*>(psVar1,&local_10);
    psVar1 = (set<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>,yyml::detail::PointerComp<yyml::nn::Variable<double>>,std::allocator<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>>>
              *)registry();
    std::
    set<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>,yyml::detail::PointerComp<yyml::nn::Variable<double>>,std::allocator<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>>>
    ::erase_abi_cxx11_(psVar1,(const_iterator)__position._M_node);
  }
  return;
}

Assistant:

static void RemoveInstance(Type *instance) {
    if (instance != nullptr && registry().find(instance) != registry().end()) {
      auto iter = registry().find(instance);
      registry().erase(iter);
    }
  }